

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

void h2o_cache_release(h2o_cache_t *cache,h2o_cache_ref_t *ref)

{
  int iVar1;
  size_t *psVar2;
  h2o_cache_ref_t *ref_local;
  h2o_cache_t *cache_local;
  
  psVar2 = &ref->_refcnt;
  LOCK();
  *psVar2 = *psVar2 - 1;
  UNLOCK();
  if (*psVar2 == 0) {
    iVar1 = h2o_linklist_is_linked(&ref->_lru_link);
    if (iVar1 != 0) {
      __assert_fail("!h2o_linklist_is_linked(&ref->_lru_link)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/cache.c"
                    ,199,"void h2o_cache_release(h2o_cache_t *, h2o_cache_ref_t *)");
    }
    iVar1 = h2o_linklist_is_linked(&ref->_age_link);
    if (iVar1 != 0) {
      __assert_fail("!h2o_linklist_is_linked(&ref->_age_link)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/cache.c"
                    ,200,"void h2o_cache_release(h2o_cache_t *, h2o_cache_ref_t *)");
    }
    if (cache->destroy_cb != (_func_void_h2o_iovec_t *)0x0) {
      (*cache->destroy_cb)(ref->value);
    }
    free((ref->key).base);
    free(ref);
  }
  return;
}

Assistant:

void h2o_cache_release(h2o_cache_t *cache, h2o_cache_ref_t *ref)
{
    if (__sync_fetch_and_sub(&ref->_refcnt, 1) == 1) {
        assert(!h2o_linklist_is_linked(&ref->_lru_link));
        assert(!h2o_linklist_is_linked(&ref->_age_link));
        if (cache->destroy_cb != NULL)
            cache->destroy_cb(ref->value);
        free(ref->key.base);
        free(ref);
    }
}